

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O3

void __thiscall ThreadPool::resize(ThreadPool *this,size_t threads)

{
  pointer *ppuVar1;
  mutex *__mutex;
  pointer puVar2;
  pointer ptVar3;
  int iVar4;
  ulong uVar5;
  imageException *this_00;
  pointer puVar6;
  unique_lock<std::mutex> _mutexLock;
  unique_lock<std::mutex> local_50;
  ulong local_40;
  ThreadPool *local_38;
  
  if (threads == 0) {
    this_00 = (imageException *)__cxa_allocate_exception(0x28);
    imageException::imageException(this_00,"Try to set zero threads in thread pool");
    __cxa_throw(this_00,&imageException::typeinfo,imageException::~imageException);
  }
  uVar5 = (long)(this->_worker).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->_worker).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3;
  if (uVar5 < threads) {
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->_taskInfo);
    if (iVar4 != 0) {
LAB_00133f3c:
      std::__throw_system_error(iVar4);
    }
    local_50._M_device._0_1_ = 1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->_run,threads,(value_type_conflict1 *)&local_50);
    local_50._M_device = (mutex_type *)((ulong)local_50._M_device._1_7_ << 8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->_exit,threads,(value_type_conflict1 *)&local_50);
    pthread_mutex_unlock((pthread_mutex_t *)&this->_taskInfo);
    this->_threadCount = threads;
    uVar5 = (long)(this->_worker).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->_worker).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3;
    if (uVar5 < threads) {
      do {
        local_40 = uVar5;
        local_38 = this;
        std::thread::thread<void(&)(ThreadPool*,unsigned_long),ThreadPool*,unsigned_long,void>
                  ((thread *)&local_50,_workerThread,&local_38,&local_40);
        std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                  (&this->_worker,(thread *)&local_50);
        if (local_50._M_device != (mutex_type *)0x0) {
LAB_00133f95:
          std::terminate();
        }
        uVar5 = (long)(this->_worker).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(this->_worker).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3;
      } while (uVar5 < threads);
    }
    local_50._M_device = &this->_creation;
    local_50._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_50);
    local_50._M_owns = true;
    if (this->_threadsCreated == false) {
      do {
        std::condition_variable::wait((unique_lock *)&this->_completeCreation);
      } while (this->_threadsCreated != true);
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_50);
  }
  else if (threads < uVar5) {
    __mutex = &this->_taskInfo;
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar4 != 0) goto LAB_00133f3c;
    puVar2 = (this->_exit).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_finish;
    puVar6 = (this->_exit).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start + threads;
    if (puVar6 != puVar2) {
      memset(puVar6,1,(long)puVar2 - (long)puVar6);
    }
    puVar2 = (this->_run).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar6 = (this->_run).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + threads;
    if (puVar6 != puVar2) {
      memset(puVar6,1,(long)puVar2 - (long)puVar6);
    }
    std::condition_variable::notify_all();
    while( true ) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      if ((ulong)((long)(this->_worker).
                        super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(this->_worker).
                        super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) <= threads) break;
      std::thread::join();
      ptVar3 = (this->_worker).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
               .super__Vector_impl_data._M_finish;
      (this->_worker).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish = ptVar3 + -1;
      if (ptVar3[-1]._M_id._M_thread != 0) goto LAB_00133f95;
      iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
      if (iVar4 != 0) goto LAB_00133f3c;
      ppuVar1 = &(this->_exit).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + -1;
      ppuVar1 = &(this->_run).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + -1;
    }
  }
  return;
}

Assistant:

void ThreadPool::resize( size_t threads )
{
    if( threads == 0 )
        throw imageException( "Try to set zero threads in thread pool" );

    if( threads > threadCount() ) {
        _taskInfo.lock();
        _run.resize( threads, 1 );
        _exit.resize( threads, 0 );
        _taskInfo.unlock();

        _threadCount = threads;

        while( threads > threadCount() )
            _worker.push_back( std::thread ( ThreadPool::_workerThread, this, threadCount() ) );

        std::unique_lock < std::mutex > _mutexLock( _creation );
        _completeCreation.wait( _mutexLock, [&] { return _threadsCreated; } );
    }
    else if( threads < threadCount() ) {
        _taskInfo.lock();

        std::fill( _exit.begin() + static_cast<std::vector < uint8_t >::difference_type>(threads), _exit.end(), 1 );
        std::fill( _run.begin()  + static_cast<std::vector < uint8_t >::difference_type>(threads), _run.end(), 1 );
        _waiting.notify_all();

        _taskInfo.unlock();

        while( threads < threadCount() ) {
            _worker.back().join();

            _worker.pop_back();

            _taskInfo.lock();

            _exit.pop_back();
            _run.pop_back();

            _taskInfo.unlock();
        }
    }
}